

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnodewalk.h
# Opt level: O0

ResultType __thiscall
ParseNodeWalker<WalkerPolicyTest>::WalkList
          (ParseNodeWalker<WalkerPolicyTest> *this,ParseNode *pnodeparent,ParseNode **pnode,
          Context context)

{
  bool bVar1;
  bool bVar2;
  ParseNodeBin *pPVar3;
  bool local_61;
  ResultType local_53;
  ParseNodePtr *local_48;
  ParseNodePtr *ppnode;
  ParseNodePtr current;
  bool first;
  ResultType result;
  Context context_local;
  ParseNode **pnode_local;
  ParseNode *pnodeparent_local;
  ParseNodeWalker<WalkerPolicyTest> *this_local;
  
  current._7_1_ =
       WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::DefaultResult
                 ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this);
  bVar1 = true;
  if (*pnode == (ParseNode *)0x0) {
LAB_00b79f5a:
    WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkReference
              ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,(ParseNode **)0x0
               ,context);
    this_local._7_1_ = current._7_1_;
  }
  else {
    this_local._7_1_ =
         WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkListNode
                   ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,*pnode,
                    context);
    bVar2 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                      (&this->super_WalkerPolicyTest,this_local._7_1_);
    if (bVar2) {
      ppnode = (ParseNodePtr *)*pnode;
      local_48 = pnode;
      while( true ) {
        if (((*(char *)ppnode != 'P') || (bVar2 = true, ((ulong)*ppnode & 0x1000000) != 0)) &&
           (bVar2 = false, *(OpCode *)ppnode == (*pnode)->nop)) {
          bVar2 = (*(ushort *)((long)ppnode + 2) & (*pnode)->grfpn & 0x100) != 0;
        }
        if (!bVar2) {
          WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkReference
                    ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,local_48,
                     context);
          if (bVar1) {
            local_61 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkFirstChild
                                 ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)
                                  this,*local_48,context);
          }
          else {
            local_61 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkNthChild
                                 ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)
                                  this,pnodeparent,*local_48,context);
          }
          current._7_1_ = local_61;
          goto LAB_00b79f5a;
        }
        pPVar3 = ParseNode::AsParseNodeBin((ParseNode *)ppnode);
        WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkReference
                  ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                   &pPVar3->pnode1,context);
        if (bVar1) {
          pPVar3 = ParseNode::AsParseNodeBin((ParseNode *)ppnode);
          local_53 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkFirstChild
                               ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                                pPVar3->pnode1,context);
        }
        else {
          pPVar3 = ParseNode::AsParseNodeBin((ParseNode *)ppnode);
          local_53 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkNthChild
                               ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                                pnodeparent,pPVar3->pnode1,context);
        }
        bVar1 = false;
        bVar2 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                          (&this->super_WalkerPolicyTest,local_53);
        if (!bVar2) break;
        pPVar3 = ParseNode::AsParseNodeBin((ParseNode *)ppnode);
        local_48 = &pPVar3->pnode2;
        ppnode = (ParseNodePtr *)*local_48;
      }
      this_local._7_1_ = local_53;
    }
  }
  return this_local._7_1_;
}

Assistant:

ResultType WalkList(ParseNode *pnodeparent, ParseNode *&pnode, Context context)
    {
        ResultType result = DefaultResult();
        bool first = true;
        if (pnode)
        {
            result = WalkListNode(pnode, context);
            if (!ContinueWalk(result)) return result;

            ParseNodePtr current = pnode;
            ParseNodePtr *ppnode = &pnode;
            // Skip list nodes and nested VarDeclList nodes
            while ((current->nop == knopList && (current->grfpn & PNodeFlags::fpnDclList) == 0) ||
                   (current->nop == pnode->nop && (current->grfpn & pnode->grfpn & PNodeFlags::fpnDclList)))
            {
                WalkReference(&current->AsParseNodeBin()->pnode1, context);
                result = first ? WalkFirstChild(current->AsParseNodeBin()->pnode1, context) : WalkNthChild(pnodeparent, current->AsParseNodeBin()->pnode1, context);
                first = false;
                if (!ContinueWalk(result)) return result;
                ppnode = &current->AsParseNodeBin()->pnode2;
                current = *ppnode;
            }
            WalkReference(ppnode, context);
            result = first ? WalkFirstChild(*ppnode, context) : WalkNthChild(pnodeparent, *ppnode, context);
        }
        // Reset the reference back.
        WalkReference(nullptr, context);
        return result;
    }